

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

PropertyString * __thiscall
Js::ScriptContext::GetPropertyString2(ScriptContext *this,char16 ch1,char16 ch2)

{
  uint uVar1;
  uint uVar2;
  Cache *pCVar3;
  PropertyStringMap **ppPVar4;
  PropertyStringMap *pPVar5;
  PropertyString **ppPVar6;
  uint j;
  uint i;
  char16 ch2_local;
  char16 ch1_local;
  ScriptContext *this_local;
  
  if (((((ushort)ch1 < 0x30) || (0x7a < (ushort)ch1)) || ((ushort)ch2 < 0x30)) ||
     (0x7a < (ushort)ch2)) {
    this_local = (ScriptContext *)0x0;
  }
  else {
    uVar1 = PropertyStringMap::PStrMapIndex(ch1);
    pCVar3 = Cache(this);
    ppPVar4 = Memory::WriteBarrierPtr::operator_cast_to_PropertyStringMap__
                        ((WriteBarrierPtr *)(pCVar3->propertyStrings + uVar1));
    if (*ppPVar4 == (PropertyStringMap *)0x0) {
      this_local = (ScriptContext *)0x0;
    }
    else {
      uVar2 = PropertyStringMap::PStrMapIndex(ch2);
      pCVar3 = Cache(this);
      pPVar5 = Memory::WriteBarrierPtr<Js::PropertyStringMap>::operator->
                         (pCVar3->propertyStrings + uVar1);
      ppPVar6 = Memory::WriteBarrierPtr::operator_cast_to_PropertyString__
                          ((WriteBarrierPtr *)(pPVar5->strLen2 + uVar2));
      this_local = (ScriptContext *)*ppPVar6;
    }
  }
  return (PropertyString *)this_local;
}

Assistant:

PropertyString* ScriptContext::GetPropertyString2(char16 ch1, char16 ch2)
    {
        if (ch1 < '0' || ch1 > 'z' || ch2 < '0' || ch2 > 'z')
        {
            return NULL;
        }
        const uint i = PropertyStringMap::PStrMapIndex(ch1);
        if (this->Cache()->propertyStrings[i] == NULL)
        {
            return NULL;
        }
        const uint j = PropertyStringMap::PStrMapIndex(ch2);
        return this->Cache()->propertyStrings[i]->strLen2[j];
    }